

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall QFormLayout::insertRow(QFormLayout *this,int row,QString *labelText,QWidget *field)

{
  bool bVar1;
  QFormLayoutPrivate *pQVar2;
  QWidget *parent;
  QFormLayout *in_RCX;
  undefined4 in_ESI;
  QLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  QLabel *unaff_retaddr;
  QLabel *label;
  QFormLayoutPrivate *d;
  QWidget *this_00;
  QFlagsStorage<Qt::WindowType> f;
  undefined4 in_stack_ffffffffffffffe0;
  QLayoutPrivate *this_01;
  undefined1 local_c [4];
  QWidget *buddy;
  
  buddy = *(QWidget **)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pQVar2 = d_func((QFormLayout *)0x4b5eb8);
  f.i = (Int)((ulong)pQVar2 >> 0x20);
  if ((in_RCX == (QFormLayout *)0x0) ||
     (bVar1 = QLayoutPrivate::checkWidget
                        (this_01,(QWidget *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0)), bVar1)) {
    this_00 = (QWidget *)0x0;
    bVar1 = QString::isEmpty((QString *)0x4b5ef0);
    parent = this_00;
    if (!bVar1) {
      parent = (QWidget *)operator_new(0x28);
      memset(local_c,0,4);
      QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x4b5f27);
      QLabel::QLabel((QLabel *)this_00,(QString *)in_RDI,parent,(WindowFlags)f.i);
      QLabel::setBuddy(unaff_retaddr,buddy);
    }
    insertRow(in_RCX,f.i,parent,(QWidget *)in_RDI);
  }
  if (*(QWidget **)(in_FS_OFFSET + 0x28) != buddy) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFormLayout::insertRow(int row, const QString &labelText, QWidget *field)
{
    Q_D(QFormLayout);
    if (field && !d->checkWidget(field))
        return;

    QLabel *label = nullptr;
    if (!labelText.isEmpty()) {
        label = new QLabel(labelText);
#ifndef QT_NO_SHORTCUT
        label->setBuddy(field);
#endif
    }
    insertRow(row, label, field);
}